

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O0

void __thiscall
Assimp::CalcTangentsProcess::SetupProperties(CalcTangentsProcess *this,Importer *pImp)

{
  uint uVar1;
  float *pfVar2;
  ai_real aVar3;
  float local_20;
  float local_1c;
  Importer *local_18;
  Importer *pImp_local;
  CalcTangentsProcess *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  if (pImp != (Importer *)0x0) {
    aVar3 = Importer::GetPropertyFloat(pImp,"PP_CT_MAX_SMOOTHING_ANGLE",45.0);
    this->configMaxAngle = aVar3;
    local_1c = 45.0;
    pfVar2 = std::min<float>(&this->configMaxAngle,&local_1c);
    local_20 = 0.0;
    pfVar2 = std::max<float>(pfVar2,&local_20);
    this->configMaxAngle = *pfVar2;
    this->configMaxAngle = this->configMaxAngle * 0.017453292;
    uVar1 = Importer::GetPropertyInteger(local_18,"PP_CT_TEXTURE_CHANNEL_INDEX",0);
    this->configSourceUV = uVar1;
    return;
  }
  __assert_fail("__null != pImp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/CalcTangentsProcess.cpp"
                ,0x52,"virtual void Assimp::CalcTangentsProcess::SetupProperties(const Importer *)")
  ;
}

Assistant:

void CalcTangentsProcess::SetupProperties(const Importer* pImp)
{
    ai_assert( NULL != pImp );

    // get the current value of the property
    configMaxAngle = pImp->GetPropertyFloat(AI_CONFIG_PP_CT_MAX_SMOOTHING_ANGLE,45.f);
    configMaxAngle = std::max(std::min(configMaxAngle,45.0f),0.0f);
    configMaxAngle = AI_DEG_TO_RAD(configMaxAngle);

    configSourceUV = pImp->GetPropertyInteger(AI_CONFIG_PP_CT_TEXTURE_CHANNEL_INDEX,0);
}